

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypePointer(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  Op OVar2;
  int32_t iVar3;
  uint32_t type_id_00;
  DiagnosticStream *pDVar4;
  string local_428;
  DiagnosticStream local_408;
  uint local_230;
  StorageClass local_22c;
  uint sampled;
  StorageClass storage_class;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *type;
  Instruction *pIStack_20;
  uint type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  type._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,2);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,type._4_4_);
  if (local_30 != (Instruction *)0x0) {
    OVar2 = Instruction::opcode(local_30);
    iVar3 = spvOpcodeGeneratesType(OVar2);
    if (iVar3 != 0) {
      local_22c = Instruction::GetOperandAs<spv::StorageClass>(pIStack_20,1);
      if (local_22c == StorageClassUniformConstant) {
        OVar2 = Instruction::opcode(local_30);
        if ((OVar2 == OpTypeArray) ||
           (OVar2 = Instruction::opcode(local_30), OVar2 == OpTypeRuntimeArray)) {
          type._4_4_ = Instruction::GetOperandAs<unsigned_int>(local_30,1);
          local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,type._4_4_);
        }
        OVar2 = Instruction::opcode(local_30);
        if ((OVar2 == OpTypeImage) &&
           (local_230 = Instruction::GetOperandAs<unsigned_int>(local_30,6), this = inst_local,
           local_230 == 2)) {
          type_id_00 = Instruction::id(pIStack_20);
          ValidationState_t::RegisterPointerToStorageImage((ValidationState_t *)this,type_id_00);
        }
      }
      bVar1 = ValidationState_t::IsValidStorageClass((ValidationState_t *)inst_local,local_22c);
      if (!bVar1) {
        ValidationState_t::diag
                  (&local_408,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_BINARY,pIStack_20);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_428,(ValidationState_t *)inst_local,0x1223,(char *)0x0);
        pDVar4 = DiagnosticStream::operator<<(&local_408,&local_428);
        pDVar4 = DiagnosticStream::operator<<
                           (pDVar4,(char (*) [45])"Invalid storage class for target environment");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        std::__cxx11::string::~string((string *)&local_428);
        DiagnosticStream::~DiagnosticStream(&local_408);
        return __local._4_4_;
      }
      return SPV_SUCCESS;
    }
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  pDVar4 = DiagnosticStream::operator<<(&local_208,(char (*) [25])"OpTypePointer Type <id> ");
  ValidationState_t::getIdName_abi_cxx11_
            ((string *)&sampled,(ValidationState_t *)inst_local,type._4_4_);
  pDVar4 = DiagnosticStream::operator<<
                     (pDVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &sampled);
  pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [16])" is not a type.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
  std::__cxx11::string::~string((string *)&sampled);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypePointer(ValidationState_t& _,
                                 const Instruction* inst) {
  auto type_id = inst->GetOperandAs<uint32_t>(2);
  auto type = _.FindDef(type_id);
  if (!type || !spvOpcodeGeneratesType(type->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpTypePointer Type <id> " << _.getIdName(type_id)
           << " is not a type.";
  }
  // See if this points to a storage image.
  const auto storage_class = inst->GetOperandAs<spv::StorageClass>(1);
  if (storage_class == spv::StorageClass::UniformConstant) {
    // Unpack an optional level of arraying.
    if (type->opcode() == spv::Op::OpTypeArray ||
        type->opcode() == spv::Op::OpTypeRuntimeArray) {
      type_id = type->GetOperandAs<uint32_t>(1);
      type = _.FindDef(type_id);
    }
    if (type->opcode() == spv::Op::OpTypeImage) {
      const auto sampled = type->GetOperandAs<uint32_t>(6);
      // 2 indicates this image is known to be be used without a sampler, i.e.
      // a storage image.
      if (sampled == 2) _.RegisterPointerToStorageImage(inst->id());
    }
  }

  if (!_.IsValidStorageClass(storage_class)) {
    return _.diag(SPV_ERROR_INVALID_BINARY, inst)
           << _.VkErrorID(4643)
           << "Invalid storage class for target environment";
  }

  return SPV_SUCCESS;
}